

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O2

TSpirvTypeParameters * __thiscall
glslang::TParseContext::makeSpirvTypeParameters
          (TParseContext *this,TSourceLoc *loc,TIntermConstantUnion *constant)

{
  int iVar1;
  vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
  *this_00;
  undefined4 extraout_var;
  char *pcVar2;
  TSpirvTypeParameter local_30;
  
  this_00 = (vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
             *)TVector<glslang::TSpirvTypeParameter>::operator_new
                         ((TVector<glslang::TSpirvTypeParameter> *)0x20,(size_t)loc);
  TVector<glslang::TSpirvTypeParameter>::TVector((TVector<glslang::TSpirvTypeParameter> *)this_00);
  iVar1 = (*(constant->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(constant);
  if ((((iVar1 != 1) &&
       (iVar1 = (*(constant->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])
                          (constant), iVar1 != 8)) &&
      (iVar1 = (*(constant->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(constant)
      , iVar1 != 9)) &&
     ((iVar1 = (*(constant->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(constant)
      , iVar1 != 0xc &&
      (iVar1 = (*(constant->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(constant)
      , iVar1 != 0x1b)))) {
    iVar1 = (*(constant->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(constant);
    pcVar2 = TType::getBasicString((TType *)CONCAT44(extraout_var,iVar1));
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"this type not allowed",pcVar2,"");
    return (TSpirvTypeParameters *)this_00;
  }
  TSpirvTypeParameter::TSpirvTypeParameter(&local_30,constant);
  std::vector<glslang::TSpirvTypeParameter,_glslang::pool_allocator<glslang::TSpirvTypeParameter>_>
  ::emplace_back<glslang::TSpirvTypeParameter>(this_00,&local_30);
  return (TSpirvTypeParameters *)this_00;
}

Assistant:

TSpirvTypeParameters* TParseContext::makeSpirvTypeParameters(const TSourceLoc& loc, const TIntermConstantUnion* constant)
{
    TSpirvTypeParameters* spirvTypeParams = new TSpirvTypeParameters;
    if (constant->getBasicType() != EbtFloat &&
        constant->getBasicType() != EbtInt &&
        constant->getBasicType() != EbtUint &&
        constant->getBasicType() != EbtBool &&
        constant->getBasicType() != EbtString)
        error(loc, "this type not allowed", constant->getType().getBasicString(), "");
    else
        spirvTypeParams->push_back(TSpirvTypeParameter(constant));

    return spirvTypeParams;
}